

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_3dVector * __thiscall
ON_Xform::operator*(ON_3dVector *__return_storage_ptr__,ON_Xform *this,ON_3dVector *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = v->x;
  dVar2 = v->y;
  dVar3 = v->z;
  ON_3dVector::ON_3dVector
            (__return_storage_ptr__,
             this->m_xform[0][2] * dVar3 + this->m_xform[0][0] * dVar1 + this->m_xform[0][1] * dVar2
             ,this->m_xform[1][2] * dVar3 +
              this->m_xform[1][0] * dVar1 + this->m_xform[1][1] * dVar2,
             dVar3 * this->m_xform[2][2] + dVar1 * this->m_xform[2][0] + dVar2 * this->m_xform[2][1]
            );
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Xform::operator*( const ON_3dVector& v ) const
{
  // Note well: The right hand column and bottom row have an important effect 
  // when transforming a Euclidean point and have no effect when transforming a vector. 
  // Be sure you understand the differences between vectors and points when applying a 4x4 transformation.
  const double x = v.x; // optimizer should put x,y,z in registers
  const double y = v.y;
  const double z = v.z;
  double xh[3];
  const double* m = &m_xform[0][0];
  xh[0] = m[0]*x + m[1]*y + m[ 2]*z;
  xh[1] = m[4]*x + m[5]*y + m[ 6]*z;
  xh[2] = m[8]*x + m[9]*y + m[10]*z;
  return ON_3dVector( xh[0],xh[1],xh[2] );
}